

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O3

string * __thiscall
helics::MessageFederateManager::localQuery_abi_cxx11_
          (string *__return_storage_ptr__,MessageFederateManager *this,string_view queryStr)

{
  bool bVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  long lVar5;
  Endpoint **ppEVar6;
  ulong uVar7;
  int iVar8;
  Endpoint *this_00;
  Endpoint **local_b8;
  pthread_rwlock_t *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string_t local_60;
  data local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (queryStr._M_len != 9) {
    return __return_storage_ptr__;
  }
  if ((char)*(long *)((long)queryStr._M_str + 8) != 's' ||
      *(long *)queryStr._M_str != 0x746e696f70646e65) {
    return __return_storage_ptr__;
  }
  bVar1 = (this->mLocalEndpoints).enabled;
  if (bVar1 == true) {
    local_b0 = (pthread_rwlock_t *)&(this->mLocalEndpoints).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&local_b0->__data);
  }
  else {
    local_b0 = (pthread_rwlock_t *)0x0;
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0.field_2._M_allocated_capacity._0_2_ = 0x5b;
  local_a0._M_string_length = 1;
  if ((this->mLocalEndpoints).m_obj.dataStorage.csize == 0) {
    iVar8 = (this->mLocalEndpoints).m_obj.dataStorage.bsize;
    uVar7 = (ulong)iVar8;
    local_b8 = (this->mLocalEndpoints).m_obj.dataStorage.dataptr;
    if (uVar7 == 0x20) {
      lVar5 = (long)(this->mLocalEndpoints).m_obj.dataStorage.dataSlotIndex;
      if (local_b8 == (Endpoint **)0x0) {
        ppEVar6 = (Endpoint **)
                  &gmlc::containers::
                   StableBlockVector<helics::Endpoint,5u,std::allocator<helics::Endpoint>>::end()::
                   emptyValue;
      }
      else {
        ppEVar6 = local_b8 + lVar5 + 1;
      }
      this_00 = *ppEVar6;
      goto LAB_001e03f6;
    }
    lVar5 = (long)(this->mLocalEndpoints).m_obj.dataStorage.dataSlotIndex;
    this_00 = local_b8[lVar5] + uVar7;
    ppEVar6 = local_b8 + lVar5;
LAB_001e03e0:
    local_b8 = local_b8 + lVar5;
  }
  else {
    local_b8 = (this->mLocalEndpoints).m_obj.dataStorage.dataptr;
    this_00 = *local_b8;
    iVar8 = (this->mLocalEndpoints).m_obj.dataStorage.bsize;
    uVar7 = 0;
    lVar5 = (long)(this->mLocalEndpoints).m_obj.dataStorage.dataSlotIndex;
    ppEVar6 = local_b8;
    if (iVar8 != 0x20) goto LAB_001e03e0;
LAB_001e03f6:
    if (local_b8 == (Endpoint **)0x0) {
      local_b8 = (Endpoint **)
                 &gmlc::containers::
                  StableBlockVector<helics::Endpoint,5u,std::allocator<helics::Endpoint>>::end()::
                  emptyValue;
    }
    else {
      local_b8 = local_b8 + lVar5 + 1;
    }
    uVar7 = 0;
    iVar8 = 0;
  }
  if (((int)uVar7 != iVar8) || (ppEVar6 != local_b8)) {
    do {
      psVar4 = Interface::getName_abi_cxx11_(&this_00->super_Interface);
      if (psVar4->_M_string_length != 0) {
        psVar4 = Interface::getName_abi_cxx11_(&this_00->super_Interface);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,pcVar2,pcVar2 + psVar4->_M_string_length);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,&local_80);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::dump(&local_60,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_40,-1,' ',true,hex);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_40);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_a0,local_60._M_dataplus._M_p,local_60._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (&local_a0,',');
      }
      iVar3 = (int)uVar7;
      uVar7 = (ulong)(iVar3 + 1U);
      if (iVar3 < 0x1f) {
        this_00 = this_00 + 1;
      }
      else {
        ppEVar6 = ppEVar6 + (ulong)(iVar3 - 0x1fU >> 5) + 1;
        uVar7 = (ulong)(iVar3 + 1U & 0x1f);
        this_00 = *ppEVar6 + uVar7;
      }
    } while (((int)uVar7 != iVar8) || (ppEVar6 != local_b8));
    if (1 < local_a0._M_string_length) {
      local_a0._M_dataplus._M_p[local_a0._M_string_length - 1] = ']';
      goto LAB_001e0567;
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (&local_a0,']');
LAB_001e0567:
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (__return_storage_ptr__,&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT62(local_a0.field_2._M_allocated_capacity._2_6_,
                             local_a0.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MessageFederateManager::localQuery(std::string_view queryStr) const
{
    std::string ret;
    if (queryStr == "endpoints") {
        ret = generateStringVector_if(
            mLocalEndpoints.lock_shared(),
            [](const auto& info) { return info.getName(); },
            [](const auto& info) { return (!info.getName().empty()); });
    }
    return ret;
}